

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O2

void nhdp_domain_delayed_mpr_recalculation(nhdp_domain *domain,nhdp_neighbor *neigh)

{
  list_entity *plVar1;
  _Bool *p_Var2;
  
  if (domain == (nhdp_domain *)0x0) {
    plVar1 = &_domain_list;
    p_Var2 = &_flooding_domain._mpr_outdated;
    while (plVar1 = plVar1->next, plVar1->prev != _domain_list.prev) {
      *(undefined1 *)&plVar1[-0x27].prev = 1;
    }
  }
  else {
    p_Var2 = &domain->_mpr_outdated;
  }
  *p_Var2 = true;
  return;
}

Assistant:

void
nhdp_domain_delayed_mpr_recalculation(struct nhdp_domain *domain, struct nhdp_neighbor *neigh __attribute__((unused))) {
  if (!domain) {
    list_for_each_element(&_domain_list, domain, _node) {
      nhdp_domain_delayed_mpr_recalculation(domain, neigh);
    }
    nhdp_domain_delayed_mpr_recalculation(&_flooding_domain, neigh);
    return;
  }

  domain->_mpr_outdated = true;
}